

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

void free_FMFormatList(FMFormatList format_list)

{
  long in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  iVar1 = 0;
  while (*(long *)(in_RDI + (long)iVar1 * 0x20) != 0) {
    free(*(void **)(in_RDI + (long)iVar1 * 0x20));
    free_field_list((FMFieldList)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    if (*(long *)(in_RDI + (long)iVar1 * 0x20 + 0x18) != 0) {
      free(*(void **)(in_RDI + (long)iVar1 * 0x20 + 0x18));
    }
    iVar1 = iVar1 + 1;
  }
  return;
}

Assistant:

extern void
free_FMFormatList(FMFormatList format_list)
{
    int i = 0;
    while(format_list[i].format_name){
	free((char*)format_list[i].format_name);
	free_field_list(format_list[i].field_list);
	if (format_list[i].opt_info) free(format_list[i].opt_info);
	i++;
    }
}